

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O0

void __thiscall Clasp::ScheduleStrategy::advanceTo(ScheduleStrategy *this,uint32 n)

{
  uint uVar1;
  uint in_ESI;
  uint *in_RDI;
  double dVar2;
  double dVar3;
  uint32 x;
  double dLen;
  uint local_c;
  
  if ((in_RDI[2] == 0) || (in_ESI < in_RDI[2])) {
    in_RDI[1] = in_ESI;
  }
  else {
    local_c = in_ESI;
    if (*in_RDI >> 0x1e == 2) {
      while (in_RDI[2] <= local_c) {
        uVar1 = in_RDI[2];
        in_RDI[2] = uVar1 + 1;
        local_c = local_c - uVar1;
        in_RDI[2] = in_RDI[2] << 1;
      }
      in_RDI[1] = local_c;
    }
    else {
      dVar2 = (double)in_RDI[2];
      dVar3 = sqrt(dVar2 * (dVar2 * 4.0 + -4.0) + (double)(in_ESI + 1) * 8.0);
      uVar1 = (uint)((ulong)(long)((dVar3 - (dVar2 + dVar2)) + 1.0) >> 1) & 0x7fffffff;
      dVar3 = (double)uVar1;
      in_RDI[1] = in_ESI - (int)(long)(dVar3 * dVar2 + (dVar3 - 1.0) * dVar3 * 0.5);
      in_RDI[2] = uVar1 + in_RDI[2];
    }
  }
  return;
}

Assistant:

void ScheduleStrategy::advanceTo(uint32 n) {
	if (!len || n < len)       {
		idx = n;
		return;
	}
	if (type != Luby) {
		double dLen = len;
		uint32 x    = uint32(sqrt(dLen * (4.0 * dLen - 4.0) + 8.0 * double(n+1))-2*dLen+1)/2;
		idx         = n - uint32(x*dLen+double(x-1.0)*x/2.0);
		len        += x;
		return;
	}
	while (n >= len) {
		n   -= len++;
		len *= 2;
	}
	idx = n;
}